

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.cpp
# Opt level: O0

void __thiscall
oout::NamedTest::NamedTest(NamedTest *this,string *name,shared_ptr<const_oout::NamedTest> *test)

{
  shared_ptr<const_oout::NamedTest> local_40;
  shared_ptr<const_oout::Test> local_30;
  shared_ptr<const_oout::NamedTest> *local_20;
  shared_ptr<const_oout::NamedTest> *test_local;
  string *name_local;
  NamedTest *this_local;
  
  local_20 = test;
  test_local = (shared_ptr<const_oout::NamedTest> *)name;
  name_local = (string *)this;
  std::make_shared<oout::SuiteTest_const,std::shared_ptr<oout::NamedTest_const>const&>(&local_40);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::SuiteTest_const,void>
            ((shared_ptr<oout::Test_const> *)&local_30,
             (shared_ptr<const_oout::SuiteTest> *)&local_40);
  NamedTest(this,name,&local_30);
  std::shared_ptr<const_oout::Test>::~shared_ptr(&local_30);
  std::shared_ptr<const_oout::SuiteTest>::~shared_ptr
            ((shared_ptr<const_oout::SuiteTest> *)&local_40);
  return;
}

Assistant:

NamedTest::NamedTest(const string &name, const shared_ptr<const NamedTest> &test)
	: NamedTest(name, make_shared<const SuiteTest>(test))
{
}